

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::modPow(SVInt *this,SVInt *base,SVInt *exponent,bool bothSigned)

{
  uint32_t uVar1;
  uint64_t *puVar2;
  undefined8 extraout_RDX;
  SVInt SVar3;
  ulong local_480;
  uint64_t word;
  uint64_t uStack_470;
  int j;
  uint64_t word_1;
  uint32_t i;
  uint32_t exponentWords;
  anon_class_8_1_f62ae5da mulReduce;
  undefined1 local_448 [8];
  SVInt baseCopy;
  TempBuffer<unsigned_long,_128UL> scratch;
  bool bothSigned_local;
  SVInt *exponent_local;
  SVInt *base_local;
  SVInt *result;
  
  uVar1 = getNumWords((base->super_SVIntStorage).bitWidth * 2,false);
  TempBuffer<unsigned_long,_128UL>::TempBuffer
            ((TempBuffer<unsigned_long,_128UL> *)&baseCopy.super_SVIntStorage.bitWidth,(ulong)uVar1)
  ;
  SVInt((SVInt *)local_448,base);
  mulReduce.scratch._3_1_ = 0;
  SVInt(this,(base->super_SVIntStorage).bitWidth,1,false);
  _i = (TempBuffer<unsigned_long,_128UL> *)&baseCopy.super_SVIntStorage.bitWidth;
  uVar1 = getNumWords(exponent);
  for (word_1._0_4_ = 0; (uint)word_1 < uVar1 - 1; word_1._0_4_ = (uint)word_1 + 1) {
    puVar2 = getRawData(exponent);
    uStack_470 = puVar2[(uint)word_1];
    for (word._4_4_ = 0; word._4_4_ < 0x40; word._4_4_ = word._4_4_ + 1) {
      if ((uStack_470 & 1) != 0) {
        modPow::anon_class_8_1_f62ae5da::operator()
                  ((anon_class_8_1_f62ae5da *)&i,this,(SVInt *)local_448,this);
      }
      modPow::anon_class_8_1_f62ae5da::operator()
                ((anon_class_8_1_f62ae5da *)&i,(SVInt *)local_448,(SVInt *)local_448,
                 (SVInt *)local_448);
      uStack_470 = uStack_470 >> 1;
    }
  }
  puVar2 = getRawData(exponent);
  for (local_480 = puVar2[uVar1 - 1]; local_480 != 0; local_480 = local_480 >> 1) {
    if ((local_480 & 1) != 0) {
      modPow::anon_class_8_1_f62ae5da::operator()
                ((anon_class_8_1_f62ae5da *)&i,this,(SVInt *)local_448,this);
    }
    if (local_480 != 1) {
      modPow::anon_class_8_1_f62ae5da::operator()
                ((anon_class_8_1_f62ae5da *)&i,(SVInt *)local_448,(SVInt *)local_448,
                 (SVInt *)local_448);
    }
  }
  setSigned(this,bothSigned);
  mulReduce.scratch._3_1_ = 1;
  ~SVInt((SVInt *)local_448);
  TempBuffer<unsigned_long,_128UL>::~TempBuffer
            ((TempBuffer<unsigned_long,_128UL> *)&baseCopy.super_SVIntStorage.bitWidth);
  SVar3.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar3.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt SVInt::modPow(const SVInt& base, const SVInt& exponent, bool bothSigned) {
    // This is based on the modular exponentiation algorithm described here:
    // https://en.wikipedia.org/wiki/Modular_exponentiation
    //
    // The result value will have the same bit width as the lhs. That's the value we'll
    // be using as the modulus in the (a * b) mod m equation.
    // Allocate a temporary scratch buffer that has 2x the number of bits so that we can
    // handle any possible intermediate multiply.
    TempBuffer<uint64_t, 128> scratch(getNumWords(base.bitWidth * 2, false));
    SVInt baseCopy = base;
    SVInt result(base.bitWidth, 1, false);

    auto mulReduce = [&](const SVInt& left, const SVInt& right, SVInt& result) {
        bitwidth_t lhsBits = left.getActiveBits();
        bitwidth_t rhsBits = right.getActiveBits();
        uint32_t lhsWords = !lhsBits ? 0 : whichWord(lhsBits - 1) + 1;
        uint32_t rhsWords = !rhsBits ? 0 : whichWord(rhsBits - 1) + 1;

        scratch.fill(0);
        mul(scratch.get(), left.getRawData(), lhsWords, right.getRawData(), rhsWords);

        uint32_t destWords = lhsWords + rhsWords;
        if (destWords >= result.getNumWords()) {
            memcpy(result.getRawData(), scratch.get(), result.getNumWords() * sizeof(uint64_t));
            result.clearUnusedBits();
        }
        else {
            memcpy(result.getRawData(), scratch.get(), destWords * sizeof(uint64_t));
            result.clearUnusedBits();
        }
    };

    // Loop through each bit of the exponent.
    uint32_t exponentWords = exponent.getNumWords();
    for (uint32_t i = 0; i < exponentWords - 1; i++) {
        uint64_t word = exponent.getRawData()[i];
        for (int j = 0; j < BITS_PER_WORD; j++) {
            if (word & 0x1)
                mulReduce(result, baseCopy, result);
            mulReduce(baseCopy, baseCopy, baseCopy);
            word >>= 1;
        }
    }

    // Unroll the last loop iteration to avoid multiplications
    // when the rest of the exponent bits are zero
    uint64_t word = exponent.getRawData()[exponentWords - 1];
    while (word) {
        if (word & 0x1)
            mulReduce(result, baseCopy, result);
        if (word != 1)
            mulReduce(baseCopy, baseCopy, baseCopy);
        word >>= 1;
    }

    result.setSigned(bothSigned);
    return result;
}